

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidLayerNormalizationNoNormalizedShape(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *pRVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  long *plVar8;
  FeatureDescription *pFVar9;
  ArrayFeatureType *pAVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  LayerUnion LVar14;
  WeightParams *pWVar15;
  float *pfVar16;
  ostream *poVar17;
  string *psVar18;
  long lVar19;
  undefined8 *puVar20;
  int iVar21;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar22;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  Arena *pAVar23;
  uint uVar24;
  Model m;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00197f94:
    pRVar22 = &(local_80.description_)->input_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar22->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar22->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar21 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_00197f94;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar4->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar23);
    (pFVar7->Type_).multiarraytype_ = pAVar10;
  }
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  if (uVar3 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  uVar24 = uVar3 + 1;
  (pAVar10->shape_).current_size_ = uVar24;
  if (uVar24 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 2);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 5;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 5;
  }
  uVar24 = uVar3 + 2;
  (pAVar10->shape_).current_size_ = uVar24;
  if (uVar24 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 3);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 2;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 2;
  }
  pRVar1->current_size_ = uVar3 + 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00198151:
    pRVar22 = &(local_80.description_)->output_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar22->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar22->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar21 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_00198151;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar4->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"output",puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar23);
    (pFVar7->Type_).multiarraytype_ = pAVar10;
  }
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  if (uVar3 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  uVar24 = uVar3 + 1;
  (pAVar10->shape_).current_size_ = uVar24;
  if (uVar24 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 2);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 5;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 5;
  }
  uVar24 = uVar3 + 2;
  (pAVar10->shape_).current_size_ = uVar24;
  if (uVar24 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 3);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 2;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar24] = 2;
  }
  pRVar1->current_size_ = uVar3 + 3;
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019832e:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(local_80.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar11);
  }
  else {
    iVar21 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_0019832e;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar21 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar21];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00198366:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar21 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_00198366;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar4->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3a8ef3);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001983b6:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar21 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001983b6;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar13 = pRVar4->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3bbdaf);
  if (pNVar11->_oneof_case_[0] == 0x546) {
    LVar14 = pNVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0x546;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    LVar14.layernormalization_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::LayerNormalizationLayerParams>(pAVar23);
    (pNVar11->layer_).layernormalization_ = (LayerNormalizationLayerParams *)LVar14;
  }
  pWVar15 = (LVar14.batchnorm_)->variance_;
  if (pWVar15 == (WeightParams *)0x0) {
    uVar5 = ((LVar14.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pWVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar23);
    (LVar14.batchnorm_)->variance_ = pWVar15;
  }
  pRVar2 = &pWVar15->floatvalue_;
  uVar3 = (pWVar15->floatvalue_).current_size_;
  if (uVar3 == (pWVar15->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
    pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar2);
    pfVar16[uVar3] = 1.0;
  }
  else {
    pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar2);
    pfVar16[uVar3] = 1.0;
  }
  pRVar2->current_size_ = uVar3 + 1;
  pWVar15 = (LVar14.gru_)->resetgateweightmatrix_;
  if (pWVar15 == (WeightParams *)0x0) {
    uVar5 = ((LVar14.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pWVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar23);
    (LVar14.gru_)->resetgateweightmatrix_ = pWVar15;
  }
  pRVar2 = &pWVar15->floatvalue_;
  uVar3 = (pWVar15->floatvalue_).current_size_;
  if (uVar3 == (pWVar15->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
    pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar2);
    pfVar16[uVar3] = 0.0;
  }
  else {
    pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar2);
    pfVar16[uVar3] = 0.0;
  }
  pRVar2->current_size_ = uVar3 + 1;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar6 = CoreML::Result::good(&local_50);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  else {
    psVar18 = CoreML::Result::message_abi_cxx11_(&local_50);
    iVar21 = 0;
    lVar19 = std::__cxx11::string::find((char *)psVar18,0x398118,0);
    if (lVar19 != -1) goto LAB_00198695;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16bd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"res.message().find(\"Normalized shape\") != std::string::npos",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  std::ostream::put((char)poVar17);
  iVar21 = 1;
  std::ostream::flush();
LAB_00198695:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return iVar21;
}

Assistant:

int testInvalidLayerNormalizationNoNormalizedShape() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(0.0);

    // not specifying the value for normalized shape
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Normalized shape") != std::string::npos);

    return 0;

}